

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O1

void __thiscall
COLLADASaxFWL::SplineLoader::SplineLoader
          (SplineLoader *this,IFilePartLoader *callingFilePartLoader,String *geometryId,
          String *geometryName)

{
  pointer pcVar1;
  Spline *this_00;
  long *plVar2;
  long *plVar3;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  SourceArrayLoader::SourceArrayLoader(&this->super_SourceArrayLoader,callingFilePartLoader);
  (this->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.super_ExtraDataLoader.
  _vptr_ExtraDataLoader = (_func_int **)&PTR__SplineLoader_00934de0;
  IFilePartLoader::createUniqueIdFromId
            (&this->mSplineUniqueId,(IFilePartLoader *)this,(geometryId->_M_dataplus)._M_p,GEOMETRY)
  ;
  this_00 = (Spline *)operator_new(0x220);
  COLLADAFW::Spline::Spline(this_00,&this->mSplineUniqueId);
  this->mSpline = this_00;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mInterpolations;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->mInterpolations;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->mVerticesInputs)._vptr_Vertices = (_func_int **)&PTR__Vertices_00934f18;
  (this->mVerticesInputs).mId._M_dataplus._M_p = (pointer)&(this->mVerticesInputs).mId.field_2;
  (this->mVerticesInputs).mId._M_string_length = 0;
  (this->mVerticesInputs).mId.field_2._M_local_buf[0] = '\0';
  (this->mVerticesInputs).mName._M_dataplus._M_p = (pointer)&(this->mVerticesInputs).mName.field_2;
  (this->mVerticesInputs).mName._M_string_length = 0;
  (this->mVerticesInputs).mName.field_2._M_local_buf[0] = '\0';
  (this->mVerticesInputs).mInputArray.mData = (InputUnshared **)0x0;
  (this->mVerticesInputs).mInputArray.mCount = 0;
  (this->mVerticesInputs).mInputArray.mCapacity = 0;
  (this->mVerticesInputs).mInputArray.mFlags = 3;
  this->mCurrentVertexInput = (InputUnshared *)0x0;
  this->mInVertices = false;
  this->mInSpline = true;
  if (geometryName->_M_string_length == 0) {
    if (geometryId->_M_string_length == 0) goto LAB_007c0e81;
    plVar3 = local_60;
    pcVar1 = (geometryId->_M_dataplus)._M_p;
    local_70[0] = plVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + geometryId->_M_string_length);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_Geometry).mName);
    plVar2 = local_70[0];
  }
  else {
    plVar3 = local_40;
    pcVar1 = (geometryName->_M_dataplus)._M_p;
    local_50[0] = plVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + geometryName->_M_string_length);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_Geometry).mName);
    plVar2 = local_50[0];
  }
  if (plVar2 != plVar3) {
    operator_delete(plVar2,*plVar3 + 1);
  }
LAB_007c0e81:
  if (geometryId->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->mSpline->super_Geometry).mOriginalId);
  }
  return;
}

Assistant:

SplineLoader::SplineLoader( IFilePartLoader* callingFilePartLoader, const String& geometryId, const String& geometryName )
		: SourceArrayLoader (callingFilePartLoader )
		, mSplineUniqueId(createUniqueIdFromId((ParserChar*)geometryId.c_str(), COLLADAFW::Geometry::ID()))
		, mSpline ( new COLLADAFW::Spline(mSplineUniqueId) )
        , mInterpolations()
        , mVerticesInputs()
        , mCurrentVertexInput( 0 )
        , mInVertices ( false )
        , mInSpline (true)
	{
        if ( !geometryName.empty() )
            mSpline->setName ( geometryName );
        else if ( !geometryId.empty() )
            mSpline->setName ( geometryId );

        if ( !geometryId.empty() )
            mSpline->setOriginalId ( geometryId );
	}